

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void xmlXPathEvalExpr(xmlXPathParserContextPtr ctxt)

{
  xmlXPathCompExprPtr pxVar1;
  int local_1c;
  int oldDepth;
  xmlXPathCompExprPtr comp;
  xmlXPathParserContextPtr ctxt_local;
  
  local_1c = 0;
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return;
  }
  pxVar1 = xmlXPathTryStreamCompile(ctxt->context,ctxt->base);
  if (pxVar1 == (xmlXPathCompExprPtr)0x0) {
    if (ctxt->context != (xmlXPathContextPtr)0x0) {
      local_1c = ctxt->context->depth;
    }
    xmlXPathCompileExpr(ctxt,1);
    if (ctxt->context != (xmlXPathContextPtr)0x0) {
      ctxt->context->depth = local_1c;
    }
    if (ctxt->error != 0) {
      return;
    }
    if (*ctxt->cur != '\0') {
      xmlXPathErr(ctxt,7);
      return;
    }
    if ((1 < ctxt->comp->nbStep) && (-1 < ctxt->comp->last)) {
      if (ctxt->context != (xmlXPathContextPtr)0x0) {
        local_1c = ctxt->context->depth;
      }
      xmlXPathOptimizeExpression(ctxt,ctxt->comp->steps + ctxt->comp->last);
      if (ctxt->context != (xmlXPathContextPtr)0x0) {
        ctxt->context->depth = local_1c;
      }
    }
  }
  else {
    if (ctxt->comp != (xmlXPathCompExprPtr)0x0) {
      xmlXPathFreeCompExpr(ctxt->comp);
    }
    ctxt->comp = pxVar1;
  }
  xmlXPathRunEval(ctxt,0);
  return;
}

Assistant:

void
xmlXPathEvalExpr(xmlXPathParserContextPtr ctxt) {
#ifdef XPATH_STREAMING
    xmlXPathCompExprPtr comp;
#endif
    int oldDepth = 0;

    if (ctxt == NULL) return;

#ifdef XPATH_STREAMING
    comp = xmlXPathTryStreamCompile(ctxt->context, ctxt->base);
    if (comp != NULL) {
        if (ctxt->comp != NULL)
	    xmlXPathFreeCompExpr(ctxt->comp);
        ctxt->comp = comp;
    } else
#endif
    {
        if (ctxt->context != NULL)
            oldDepth = ctxt->context->depth;
	xmlXPathCompileExpr(ctxt, 1);
        if (ctxt->context != NULL)
            ctxt->context->depth = oldDepth;
        CHECK_ERROR;

        /* Check for trailing characters. */
        if (*ctxt->cur != 0)
            XP_ERROR(XPATH_EXPR_ERROR);

	if ((ctxt->comp->nbStep > 1) && (ctxt->comp->last >= 0)) {
            if (ctxt->context != NULL)
                oldDepth = ctxt->context->depth;
	    xmlXPathOptimizeExpression(ctxt,
		&ctxt->comp->steps[ctxt->comp->last]);
            if (ctxt->context != NULL)
                ctxt->context->depth = oldDepth;
        }
    }

    xmlXPathRunEval(ctxt, 0);
}